

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BasicPlatformDebug.cpp
# Opt level: O0

String * __thiscall
Diligent::BasicPlatformDebug::FormatDebugMessage_abi_cxx11_
          (String *__return_storage_ptr__,BasicPlatformDebug *this,DEBUG_MESSAGE_SEVERITY Severity,
          Char *Message,char *Function,char *File,int Line)

{
  char *pcVar1;
  ostream *poVar2;
  undefined4 in_register_00000014;
  Char *MessageSevery;
  stringstream msg_ss;
  ostream local_1b0 [380];
  int local_34;
  char *pcStack_30;
  int Line_local;
  char *File_local;
  char *Function_local;
  Char *Message_local;
  String *pSStack_10;
  DEBUG_MESSAGE_SEVERITY Severity_local;
  
  local_34 = (int)File;
  Message_local._4_4_ = (int)this;
  Function_local = (char *)CONCAT44(in_register_00000014,Severity);
  pcStack_30 = Function;
  File_local = Message;
  pSStack_10 = __return_storage_ptr__;
  std::__cxx11::stringstream::stringstream((stringstream *)&MessageSevery);
  pcVar1 = FormatDebugMessage::strSeverities[Message_local._4_4_];
  poVar2 = std::operator<<(local_1b0,"Diligent Engine: ");
  std::operator<<(poVar2,pcVar1);
  if ((File_local != (char *)0x0) || (pcStack_30 != (char *)0x0)) {
    std::operator<<(local_1b0," in ");
    if (File_local != (char *)0x0) {
      poVar2 = std::operator<<(local_1b0,File_local);
      std::operator<<(poVar2,"()");
      if (pcStack_30 != (char *)0x0) {
        std::operator<<(local_1b0," (");
      }
    }
    if (pcStack_30 != (char *)0x0) {
      poVar2 = std::operator<<(local_1b0,pcStack_30);
      poVar2 = std::operator<<(poVar2,", ");
      poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_34);
      std::operator<<(poVar2,')');
    }
  }
  poVar2 = std::operator<<(local_1b0,": ");
  poVar2 = std::operator<<(poVar2,Function_local);
  std::operator<<(poVar2,'\n');
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream((stringstream *)&MessageSevery);
  return __return_storage_ptr__;
}

Assistant:

String BasicPlatformDebug::FormatDebugMessage(DEBUG_MESSAGE_SEVERITY Severity,
                                              const Char*            Message,
                                              const char*            Function, // type of __FUNCTION__
                                              const char*            File,     // type of __FILE__
                                              int                    Line)
{
    std::stringstream msg_ss;

    static const Char* const strSeverities[] = {"Info", "Warning", "ERROR", "CRITICAL ERROR"};
    const auto*              MessageSevery   = strSeverities[static_cast<int>(Severity)];

    msg_ss << "Diligent Engine: " << MessageSevery;
    if (Function != nullptr || File != nullptr)
    {
        msg_ss << " in ";
        if (Function != nullptr)
        {
            msg_ss << Function << "()";
            if (File != nullptr)
                msg_ss << " (";
        }

        if (File != nullptr)
        {
            msg_ss << File << ", " << Line << ')';
        }
    }
    msg_ss << ": " << Message << '\n';

    return msg_ss.str();
}